

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::EndGroup(void)

{
  ImVec2 *lhs;
  ImGuiItemStatusFlags *pIVar1;
  ImVec2 *lhs_00;
  float fVar2;
  float fVar3;
  ImVec2 IVar4;
  char cVar5;
  ImGuiID IVar6;
  uint uVar7;
  ImGuiGroupData *pIVar8;
  ImGuiWindow *pIVar9;
  ImVec2 IVar10;
  undefined8 uVar11;
  bool bVar12;
  ImGuiContext *pIVar13;
  bool bVar14;
  long lVar15;
  char cVar16;
  ImGuiID IVar17;
  bool bVar18;
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [16];
  ImRect group_bb;
  ImVec2 local_38;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  pIVar13 = GImGui;
  lVar15 = (long)(GImGui->GroupStack).Size;
  pIVar8 = (GImGui->GroupStack).Data;
  pIVar9 = GImGui->CurrentWindow;
  lhs = &(pIVar9->DC).CursorMaxPos;
  auVar19._0_8_ = ImMax(lhs,&pIVar8[lVar15 + -1].BackupCursorPos);
  auVar19._8_56_ = extraout_var;
  IVar10 = pIVar8[lVar15 + -1].BackupCursorPos;
  lhs_00 = &pIVar8[lVar15 + -1].BackupCursorMaxPos;
  group_bb.Max = (ImVec2)vmovlps_avx(auVar19._0_16_);
  (pIVar9->DC).CursorPos = IVar10;
  group_bb.Min = IVar10;
  auVar20._0_8_ = ImMax(lhs_00,lhs);
  auVar20._8_56_ = extraout_var_00;
  IVar4 = (ImVec2)vmovlps_avx(auVar20._0_16_);
  (pIVar9->DC).CursorMaxPos = IVar4;
  (pIVar9->DC).Indent.x = ((ImVec1 *)(lhs_00 + 1))->x;
  (pIVar9->DC).GroupOffset.x = ((ImVec1 *)(lhs_00 + 1))[1].x;
  (pIVar9->DC).CurrLineSize = lhs_00[2];
  fVar2 = lhs_00[3].x;
  (pIVar9->DC).CurrLineTextBaseOffset = fVar2;
  if (pIVar13->LogEnabled == true) {
    pIVar13->LogLinePosY = -3.4028235e+38;
  }
  if (pIVar8[lVar15 + -1].EmitItem != true) goto LAB_00260d6b;
  fVar3 = (pIVar9->DC).PrevLineTextBaseOffset;
  auVar21._8_8_ = 0;
  auVar21._0_4_ = IVar10.x;
  auVar21._4_4_ = IVar10.y;
  uVar11 = vcmpss_avx512f(ZEXT416((uint)fVar2),ZEXT416((uint)fVar3),2);
  bVar18 = (bool)((byte)uVar11 & 1);
  (pIVar9->DC).CurrLineTextBaseOffset =
       (float)((uint)bVar18 * (int)fVar3 + (uint)!bVar18 * (int)fVar2);
  auVar21 = vsubps_avx(auVar19._0_16_,auVar21);
  local_38 = (ImVec2)vmovlps_avx(auVar21);
  ItemSize(&local_38,-1.0);
  ItemAdd(&group_bb,0,(ImRect *)0x0,1);
  IVar6 = pIVar13->ActiveId;
  if (pIVar8[lVar15 + -1].BackupActiveIdIsAlive == IVar6) {
    if (pIVar8[lVar15 + -1].BackupActiveIdPreviousFrameIsAlive == false) {
      cVar5 = pIVar13->ActiveIdPreviousFrameIsAlive;
joined_r0x00260d06:
      if (cVar5 != '\0') {
        IVar17 = pIVar13->ActiveIdPreviousFrame;
        cVar5 = '\x01';
        bVar14 = false;
        goto LAB_00260cfa;
      }
    }
    bVar12 = false;
    cVar16 = '\0';
  }
  else {
    bVar18 = pIVar13->ActiveIdIsAlive != IVar6;
    IVar17 = IVar6;
    if (pIVar8[lVar15 + -1].BackupActiveIdPreviousFrameIsAlive == false) {
      cVar5 = pIVar13->ActiveIdPreviousFrameIsAlive;
      bVar14 = true;
      if (IVar6 == 0 || bVar18) goto joined_r0x00260d06;
    }
    else {
      bVar12 = false;
      cVar16 = '\0';
      cVar5 = '\0';
      bVar14 = true;
      if (IVar6 == 0 || bVar18) goto LAB_00260d0c;
    }
LAB_00260cfa:
    bVar12 = bVar14;
    cVar16 = cVar5;
    (pIVar13->LastItemData).ID = IVar17;
  }
LAB_00260d0c:
  (pIVar13->LastItemData).Rect.Min = group_bb.Min;
  (pIVar13->LastItemData).Rect.Max = group_bb.Max;
  if ((pIVar8[lVar15 + -1].BackupHoveredIdIsAlive == false) && (pIVar13->HoveredId != 0)) {
    pIVar1 = &(pIVar13->LastItemData).StatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 0x80;
  }
  if ((bVar12) && (pIVar13->ActiveIdHasBeenEditedThisFrame == true)) {
    pIVar1 = &(pIVar13->LastItemData).StatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 4;
  }
  uVar7 = (pIVar13->LastItemData).StatusFlags;
  (pIVar13->LastItemData).StatusFlags = uVar7 | 0x20;
  if ((cVar16 != '\0') && (IVar6 != pIVar13->ActiveIdPreviousFrame)) {
    (pIVar13->LastItemData).StatusFlags = uVar7 | 0x60;
  }
LAB_00260d6b:
  (pIVar13->GroupStack).Size = (pIVar13->GroupStack).Size + -1;
  return;
}

Assistant:

void ImGui::EndGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(g.GroupStack.Size > 0); // Mismatched BeginGroup()/EndGroup() calls

    ImGuiGroupData& group_data = g.GroupStack.back();
    IM_ASSERT(group_data.WindowID == window->ID); // EndGroup() in wrong window?

    ImRect group_bb(group_data.BackupCursorPos, ImMax(window->DC.CursorMaxPos, group_data.BackupCursorPos));

    window->DC.CursorPos = group_data.BackupCursorPos;
    window->DC.CursorMaxPos = ImMax(group_data.BackupCursorMaxPos, window->DC.CursorMaxPos);
    window->DC.Indent = group_data.BackupIndent;
    window->DC.GroupOffset = group_data.BackupGroupOffset;
    window->DC.CurrLineSize = group_data.BackupCurrLineSize;
    window->DC.CurrLineTextBaseOffset = group_data.BackupCurrLineTextBaseOffset;
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce a carriage return

    if (!group_data.EmitItem)
    {
        g.GroupStack.pop_back();
        return;
    }

    window->DC.CurrLineTextBaseOffset = ImMax(window->DC.PrevLineTextBaseOffset, group_data.BackupCurrLineTextBaseOffset);      // FIXME: Incorrect, we should grab the base offset from the *first line* of the group but it is hard to obtain now.
    ItemSize(group_bb.GetSize());
    ItemAdd(group_bb, 0, NULL, ImGuiItemFlags_NoTabStop);

    // If the current ActiveId was declared within the boundary of our group, we copy it to LastItemId so IsItemActive(), IsItemDeactivated() etc. will be functional on the entire group.
    // It would be be neater if we replaced window.DC.LastItemId by e.g. 'bool LastItemIsActive', but would put a little more burden on individual widgets.
    // Also if you grep for LastItemId you'll notice it is only used in that context.
    // (The two tests not the same because ActiveIdIsAlive is an ID itself, in order to be able to handle ActiveId being overwritten during the frame.)
    const bool group_contains_curr_active_id = (group_data.BackupActiveIdIsAlive != g.ActiveId) && (g.ActiveIdIsAlive == g.ActiveId) && g.ActiveId;
    const bool group_contains_prev_active_id = (group_data.BackupActiveIdPreviousFrameIsAlive == false) && (g.ActiveIdPreviousFrameIsAlive == true);
    if (group_contains_curr_active_id)
        g.LastItemData.ID = g.ActiveId;
    else if (group_contains_prev_active_id)
        g.LastItemData.ID = g.ActiveIdPreviousFrame;
    g.LastItemData.Rect = group_bb;

    // Forward Hovered flag
    const bool group_contains_curr_hovered_id = (group_data.BackupHoveredIdIsAlive == false) && g.HoveredId != 0;
    if (group_contains_curr_hovered_id)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredWindow;

    // Forward Edited flag
    if (group_contains_curr_active_id && g.ActiveIdHasBeenEditedThisFrame)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_Edited;

    // Forward Deactivated flag
    g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HasDeactivated;
    if (group_contains_prev_active_id && g.ActiveId != g.ActiveIdPreviousFrame)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_Deactivated;

    g.GroupStack.pop_back();
    //window->DrawList->AddRect(group_bb.Min, group_bb.Max, IM_COL32(255,0,255,255));   // [Debug]
}